

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution.cpp
# Opt level: O0

size_t __thiscall solution::next_possible_step_ix(solution *this,size_t ix)

{
  bool bVar1;
  deque<step,_std::allocator<step>_> *pdVar2;
  deque<step,_std::allocator<step>_> *in_RSI;
  step *in_RDI;
  size_type in_stack_ffffffffffffffd8;
  deque<step,_std::allocator<step>_> *this_00;
  deque<step,_std::allocator<step>_> *local_10;
  
  local_10 = in_RSI;
  while( true ) {
    this_00 = local_10;
    pdVar2 = (deque<step,_std::allocator<step>_> *)
             std::deque<step,_std::allocator<step>_>::size
                       ((deque<step,_std::allocator<step>_> *)0x10e510);
    if (pdVar2 <= this_00) {
      return (size_t)local_10;
    }
    std::deque<step,_std::allocator<step>_>::operator[](this_00,in_stack_ffffffffffffffd8);
    bVar1 = step::can_apply(in_RDI);
    if (bVar1) break;
    local_10 = (deque<step,_std::allocator<step>_> *)
               ((long)&(local_10->super__Deque_base<step,_std::allocator<step>_>)._M_impl.
                       super__Deque_impl_data._M_map + 1);
  }
  return (size_t)local_10;
}

Assistant:

std::size_t solution::next_possible_step_ix(std::size_t ix)
{
	for (; ix < possible_steps.size(); ++ix) {
		if (possible_steps[ix].can_apply())
			break;
	}
	return ix;
}